

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O1

int chaiscript::dispatch::detail::call_func<std::function<int(int)>,int,int,0ul>
              (undefined8 param_1,_Base_ptr param_2,undefined8 *param_3,
              Type_Conversions_State *param_4)

{
  element_type *peVar1;
  type_info *ptVar2;
  type_info *ptVar3;
  bool bVar4;
  int iVar5;
  int *piVar6;
  undefined8 *puVar7;
  Boxed_Value *bv;
  undefined1 auStack_80 [72];
  _Base_ptr p_Stack_38;
  int local_c;
  
  bv = (Boxed_Value *)*param_3;
  local_c = boxed_cast<int>(bv,param_4);
  if (param_2->_M_left != (_Base_ptr)0x0) {
    iVar5 = (*(code *)param_2->_M_right)(param_2,&local_c);
    return iVar5;
  }
  std::__throw_bad_function_call();
  p_Stack_38 = param_2;
  if (param_4 != (Type_Conversions_State *)0x0) {
    auStack_80._0_8_ = &int::typeinfo;
    auStack_80._8_8_ = &int::typeinfo;
    auStack_80._16_4_ = 0x10;
    bVar4 = Type_Info::bare_equal
                      (&((bv->m_data).
                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->m_type_info,(Type_Info *)auStack_80);
    if ((!bVar4) &&
       (bVar4 = Type_Conversions::convertable_type<int>((param_4->m_conversions)._M_data), bVar4)) {
      if ((param_4 != (Type_Conversions_State *)0x0) &&
         (bVar4 = Type_Conversions::convertable_type<int>((param_4->m_conversions)._M_data), bVar4))
      {
        auStack_80._24_8_ = &int::typeinfo;
        auStack_80._32_8_ = &int::typeinfo;
        auStack_80._40_4_ = 0x10;
        Type_Conversions::boxed_type_conversion
                  ((Type_Conversions *)auStack_80,(Type_Info *)(param_4->m_conversions)._M_data,
                   (Conversion_Saves *)(auStack_80 + 0x18),(Boxed_Value *)(param_4->m_saves)._M_data
                  );
        piVar6 = (int *)chaiscript::detail::verify_type<void>
                                  ((Boxed_Value *)auStack_80,(type_info *)&int::typeinfo,
                                   *(void **)(auStack_80._0_8_ + 0x28));
        iVar5 = *piVar6;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_80._8_8_ ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          return iVar5;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_80._8_8_);
        return iVar5;
      }
      puVar7 = (undefined8 *)__cxa_allocate_exception(0x38);
      peVar1 = (bv->m_data).
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      auStack_80._16_4_ = (peVar1->m_type_info).m_flags;
      auStack_80._20_4_ = *(undefined4 *)&(peVar1->m_type_info).field_0x14;
      ptVar2 = (peVar1->m_type_info).m_type_info;
      ptVar3 = (peVar1->m_type_info).m_bare_type_info;
      *puVar7 = &PTR__bad_cast_00176aa0;
      auStack_80._0_4_ = SUB84(ptVar2,0);
      auStack_80._4_4_ = (undefined4)((ulong)ptVar2 >> 0x20);
      auStack_80._8_4_ = SUB84(ptVar3,0);
      auStack_80._12_4_ = (undefined4)((ulong)ptVar3 >> 0x20);
      *(undefined4 *)(puVar7 + 1) = auStack_80._0_4_;
      *(undefined4 *)((long)puVar7 + 0xc) = auStack_80._4_4_;
      *(undefined4 *)(puVar7 + 2) = auStack_80._8_4_;
      *(undefined4 *)((long)puVar7 + 0x14) = auStack_80._12_4_;
      puVar7[3] = auStack_80._16_8_;
      puVar7[4] = &int::typeinfo;
      puVar7[5] = 0x19;
      puVar7[6] = "Cannot perform boxed_cast";
      auStack_80._0_8_ = ptVar2;
      auStack_80._8_8_ = ptVar3;
      __cxa_throw(puVar7,&exception::bad_boxed_cast::typeinfo,std::bad_cast::~bad_cast);
    }
  }
  piVar6 = (int *)chaiscript::detail::verify_type<void>
                            (bv,(type_info *)&int::typeinfo,
                             ((bv->m_data).
                              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->m_const_data_ptr);
  return *piVar6;
}

Assistant:

Ret call_func(Ret (*)(Params...),
                    std::index_sequence<I...>,
                    const Callable &f,
                    [[maybe_unused]] const chaiscript::Function_Params &params,
                    [[maybe_unused]] const Type_Conversions_State &t_conversions) {
        return f(boxed_cast<Params>(params[I], &t_conversions)...);
      }